

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raytraced_renderer.cpp
# Opt level: O0

void __thiscall CGL::RaytracedRenderer::~RaytracedRenderer(RaytracedRenderer *this)

{
  PathTracer *this_00;
  OfflineRenderer *in_RDI;
  BVHAccel *this_01;
  
  in_RDI->_vptr_OfflineRenderer = (_func_int **)&PTR__RaytracedRenderer_00398688;
  this_01 = (BVHAccel *)in_RDI[4].cell_br.x;
  if (this_01 != (BVHAccel *)0x0) {
    CGL::SceneObjects::BVHAccel::~BVHAccel(this_01);
    operator_delete(this_01);
  }
  this_00 = (PathTracer *)in_RDI[1]._vptr_OfflineRenderer;
  if (this_00 != (PathTracer *)0x0) {
    CGL::PathTracer::~PathTracer(this_00);
    operator_delete(this_00);
  }
  std::__cxx11::string::~string((string *)&in_RDI[0xd].cell_tl.y);
  std::vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_>::~vector
            ((vector<CGL::LoggedRay,_std::allocator<CGL::LoggedRay>_> *)this_01);
  std::
  stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
  ::~stack((stack<CGL::SceneObjects::BVHNode_*,_std::deque<CGL::SceneObjects::BVHNode_*,_std::allocator<CGL::SceneObjects::BVHNode_*>_>_>
            *)0x150582);
  std::condition_variable::~condition_variable((condition_variable *)&in_RDI[8].render_cell);
  WorkQueue<CGL::WorkItem>::~WorkQueue((WorkQueue<CGL::WorkItem> *)0x1505a4);
  std::vector<std::thread_*,_std::allocator<std::thread_*>_>::~vector
            ((vector<std::thread_*,_std::allocator<std::thread_*>_> *)this_01);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  ImageBuffer::~ImageBuffer((ImageBuffer *)0x1505d7);
  std::__cxx11::string::~string((string *)&in_RDI[3].render_cell);
  std::__cxx11::string::~string((string *)&in_RDI[3].cell_tl);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_01);
  OfflineRenderer::~OfflineRenderer(in_RDI);
  return;
}

Assistant:

RaytracedRenderer::~RaytracedRenderer() {

  delete bvh;
  delete pt;

}